

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O0

void Am_Set_Animated_Slots(Am_Object *interp)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Value *pAVar4;
  Am_Constraint *constraint_00;
  byte local_b4;
  Am_Value_List local_78;
  undefined1 local_68 [8];
  Am_Value_List values;
  Am_Value_List slots;
  Am_Constraint *constraint;
  Am_Value *slot_to_animate;
  Am_Object obj;
  undefined1 local_20 [8];
  Am_Value curr_value;
  Am_Object *interp_local;
  
  curr_value.value = (anon_union_8_8_ea4c8939_for_value)interp;
  pAVar3 = Am_Object::Get(interp,0x169,0);
  Am_Value::Am_Value((Am_Value *)local_20,pAVar3);
  bVar1 = Am_Value::Exists((Am_Value *)local_20);
  if (bVar1) {
    Am_Object::Get_Object((Am_Object *)&slot_to_animate,(Am_Slot_Key)interp,0x193);
    bVar1 = Am_Object::Valid((Am_Object *)&slot_to_animate);
    if (bVar1) {
      pAVar3 = Am_Object::Get(interp,0xeb,0);
      pAVar4 = Am_Object::Get(interp,0xf6,0);
      constraint_00 = (Am_Constraint *)Am_Value::operator_cast_to_void_(pAVar4);
      bVar1 = Am_Value_List::Test(pAVar3);
      if (bVar1) {
        Am_Value_List::Am_Value_List((Am_Value_List *)&values.item,pAVar3);
        bVar1 = Am_Value_List::Test((Am_Value *)local_20);
        if (bVar1) {
          Am_Value_List::Am_Value_List((Am_Value_List *)local_68,(Am_Value *)local_20);
          Am_Value_List::Start((Am_Value_List *)local_68);
          Am_Value_List::Start((Am_Value_List *)&values.item);
          while( true ) {
            bVar1 = Am_Value_List::Last((Am_Value_List *)&values.item);
            local_b4 = 0;
            if (!bVar1) {
              bVar1 = Am_Value_List::Last((Am_Value_List *)local_68);
              local_b4 = bVar1 ^ 0xff;
            }
            if ((local_b4 & 1) == 0) break;
            pAVar3 = Am_Value_List::Get((Am_Value_List *)&values.item);
            iVar2 = Am_Value::operator_cast_to_int(pAVar3);
            pAVar3 = Am_Value_List::Get((Am_Value_List *)local_68);
            set_animated_slot((Am_Slot_Key)iVar2,(Am_Object_Advanced *)&slot_to_animate,
                              constraint_00,pAVar3);
            Am_Value_List::Next((Am_Value_List *)local_68);
            Am_Value_List::Next((Am_Value_List *)&values.item);
          }
          Am_Value_List::~Am_Value_List((Am_Value_List *)local_68);
        }
        else {
          pAVar3 = Am_Value_List::Get((Am_Value_List *)&values.item);
          iVar2 = Am_Value::operator_cast_to_int(pAVar3);
          set_animated_slot((Am_Slot_Key)iVar2,(Am_Object_Advanced *)&slot_to_animate,constraint_00,
                            (Am_Value *)local_20);
        }
        Am_Value_List::~Am_Value_List((Am_Value_List *)&values.item);
      }
      else {
        bVar1 = Am_Value_List::Test((Am_Value *)local_20);
        if (bVar1) {
          Am_Value_List::Am_Value_List(&local_78,(Am_Value *)local_20);
          pAVar4 = Am_Value_List::Get(&local_78);
          Am_Value::operator=((Am_Value *)local_20,pAVar4);
          Am_Value_List::~Am_Value_List(&local_78);
        }
        iVar2 = Am_Value::operator_cast_to_int(pAVar3);
        set_animated_slot((Am_Slot_Key)iVar2,(Am_Object_Advanced *)&slot_to_animate,constraint_00,
                          (Am_Value *)local_20);
      }
      obj.data._0_4_ = 0;
    }
    else {
      obj.data._0_4_ = 1;
    }
    Am_Object::~Am_Object((Am_Object *)&slot_to_animate);
  }
  else {
    obj.data._0_4_ = 1;
  }
  Am_Value::~Am_Value((Am_Value *)local_20);
  return;
}

Assistant:

void
Am_Set_Animated_Slots(Am_Object interp)
{
  Am_Value curr_value = interp.Get(Am_VALUE);
  if (!curr_value.Exists())
    return;

  Am_Object obj = interp.Get_Object(Am_OPERATES_ON);
  if (!obj.Valid())
    return;

  // pass the computed value back to the animation constraint
  const Am_Value& slot_to_animate = interp.Get(Am_SLOT_TO_ANIMATE);
  Am_Constraint *constraint;

  constraint = (Am_Constraint *)(Am_Ptr)interp.Get(Am_ANIM_CONSTRAINT);

  //
  // Do we have a list of slots or just one?
  //
  if (Am_Value_List::Test(slot_to_animate)) {
    Am_Value_List slots = slot_to_animate;

    //
    // Do we have a list of values, or just one?
    //
    if (Am_Value_List::Test(curr_value)) {
      Am_Value_List values = curr_value;

      values.Start();

      //
      // Go through both lists, until one of them runs out, assigning
      // each slot the corresponding value.
      //
      for (slots.Start(); !slots.Last() && !values.Last(); slots.Next()) {
        set_animated_slot((int)slots.Get(), (Am_Object_Advanced &)obj,
                          constraint, values.Get());
        values.Next();
      }
    } else {
      //
      // We've only got a single value, so assign it just to the
      // first slot.
      //
      set_animated_slot((int)slots.Get(), (Am_Object_Advanced &)obj, constraint,
                        curr_value);
    }
  }
  //
  // We come here if we only have a single slot.
  //
  else {
    //
    // If `curr_value' is really a list, then get its first value.
    //
    if (Am_Value_List::Test(curr_value))
      curr_value = ((Am_Value_List)curr_value).Get();

    //
    // We have just one slot so assign it the value.
    //
    set_animated_slot((int)slot_to_animate, (Am_Object_Advanced &)obj,
                      constraint, curr_value);
  }
}